

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O3

void __thiscall LexerTabs::Run(LexerTabs *this)

{
  Test *this_00;
  Token TVar1;
  int iVar2;
  Lexer lexer;
  string local_70;
  Lexer local_50;
  
  Lexer::Lexer(&local_50,"   \tfoobar");
  TVar1 = Lexer::ReadToken(&local_50);
  testing::Test::Check
            (g_current_test,TVar1 == INDENT,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x5e,"Lexer::INDENT == token");
  TVar1 = Lexer::ReadToken(&local_50);
  testing::Test::Check
            (g_current_test,TVar1 == ERROR,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x60,"Lexer::ERROR == token");
  this_00 = g_current_test;
  Lexer::DescribeLastError_abi_cxx11_(&local_70,&local_50);
  iVar2 = std::__cxx11::string::compare((char *)&local_70);
  testing::Test::Check
            (this_00,iVar2 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x61,"\"tabs are not allowed, use spaces\" == lexer.DescribeLastError()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(Lexer, Tabs) {
  // Verify we print a useful error on a disallowed character.
  Lexer lexer("   \tfoobar");
  Lexer::Token token = lexer.ReadToken();
  EXPECT_EQ(Lexer::INDENT, token);
  token = lexer.ReadToken();
  EXPECT_EQ(Lexer::ERROR, token);
  EXPECT_EQ("tabs are not allowed, use spaces", lexer.DescribeLastError());
}